

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

bool __thiscall ON_FileIterator::NextItem(ON_FileIterator *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  char *__file;
  ON__UINT64 saved_count;
  wchar_t *current_name_ext;
  wchar_t *file_name_filter;
  undefined1 local_10f8 [4];
  int stat_errno;
  stat buf;
  char *utf8path;
  ON_String utf8buffer;
  ON_wString local_1040;
  ON_wString wpath;
  dirent *pdStack_1030;
  int readdir_errno;
  dirent *dp;
  wchar_t current_name [1024];
  undefined8 local_20;
  ON__UINT64 current_file_attributes;
  ON_FileIterator *this_local;
  
  ON_wString::operator=((ON_wString *)(this + 0x18),&ON_wString::EmptyString);
  ON_wString::operator=((ON_wString *)(this + 0x20),&ON_wString::EmptyString);
  if (*(int *)this == 1) {
    this_local._7_1_ = FirstItem(this);
  }
  else if (*(int *)this == 2) {
    do {
      do {
        pdStack_1030 = (dirent *)0x0;
        wpath.m_s._4_4_ =
             readdir_r(*(DIR **)(*(long *)(this + 0x30) + 0x10),
                       (dirent *)(*(long *)(this + 0x30) + 0x18),&stack0xffffffffffffefd0);
        if (((wpath.m_s._4_4_ != 0) || (pdStack_1030 == (dirent *)0x0)) ||
           (*(char *)(*(long *)(this + 0x30) + 0x2b) == '\0')) {
          uVar1 = *(undefined8 *)(this + 0x28);
          Reset(this);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined4 *)this = 3;
          this_local._7_1_ = 0;
          goto LAB_0060f466;
        }
        bVar2 = IsDotOrDotDotDir((char *)(*(long *)(this + 0x30) + 0x2b));
      } while (bVar2);
      memset(&dp,0,0x1000);
      ON_ConvertUTF8ToWideChar
                (0,(char *)(*(long *)(this + 0x30) + 0x2b),-1,(wchar_t *)&dp,0x3ff,(uint *)0x0,0x1c,
                 0,(char **)0x0);
      ON_wString::ON_wString(&local_1040,(ON_wString *)(this + 8));
      ON_wString::operator+=(&local_1040,'/');
      ON_wString::operator+=(&local_1040,(wchar_t *)&dp);
      ON_String::ON_String((ON_String *)&utf8path,&local_1040);
      __file = ON_String::operator_cast_to_char_((ON_String *)&utf8path);
      if (__file == (char *)0x0) {
        buf.__glibc_reserved[2]._4_4_ = 3;
      }
      else {
        memset(local_10f8,0,0x90);
        file_name_filter._4_4_ = stat(__file,(stat *)local_10f8);
        if (file_name_filter._4_4_ == 0) {
          if (((uint)buf.st_nlink & 0xf000) == 0x4000) {
            local_20 = 2;
          }
          else {
            if (((uint)buf.st_nlink & 0xf000) != 0x8000) {
              buf.__glibc_reserved[2]._4_4_ = 3;
              goto LAB_0060f3fb;
            }
            current_name_ext = ON_wString::operator_cast_to_wchar_t_(*(ON_wString **)(this + 0x30));
            if (((current_name_ext != (wchar_t *)0x0) && (*current_name_ext == L'*')) &&
               ((current_name_ext[1] == L'.' &&
                ((current_name_ext[2] != L'\0' && (current_name_ext[2] != L'*')))))) {
              saved_count = 0;
              on_wsplitpath((wchar_t *)&dp,(wchar_t **)0x0,(wchar_t **)0x0,(wchar_t **)0x0,
                            (wchar_t **)&saved_count);
              if ((saved_count == 0) ||
                 (iVar3 = wcscmp(current_name_ext + 1,(wchar_t *)saved_count), iVar3 != 0)) {
                buf.__glibc_reserved[2]._4_4_ = 3;
                goto LAB_0060f3fb;
              }
            }
            local_20 = 1;
          }
          memcpy((void *)(*(long *)(this + 0x30) + 0x230),&dp,0x1000);
          *(undefined8 *)(*(long *)(this + 0x30) + 0x1230) = local_20;
          *(__dev_t *)(*(long *)(this + 0x30) + 0x1238) = buf.st_rdev;
          *(__syscall_slong_t *)(*(long *)(this + 0x30) + 0x1240) = buf.st_atim.tv_nsec;
          ON_wString::operator=
                    ((ON_wString *)(this + 0x18),(wchar_t *)(*(long *)(this + 0x30) + 0x230));
          ON_wString::operator=((ON_wString *)(this + 0x20),&ON_wString::EmptyString);
          this_local._7_1_ = 1;
          buf.__glibc_reserved[2]._4_4_ = 1;
        }
        else {
          buf.__glibc_reserved[2]._4_4_ = 3;
        }
      }
LAB_0060f3fb:
      ON_String::~ON_String((ON_String *)&utf8path);
      ON_wString::~ON_wString(&local_1040);
    } while (buf.__glibc_reserved[2]._4_4_ != 1);
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0060f466:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_FileIterator::NextItem()
{
  m_item_name = ON_wString::EmptyString;
  m_full_path_name = ON_wString::EmptyString;
  if ( 1 == m_state )
    return FirstItem();
  if ( 2 != m_state )
    return false;

#if defined(ON_COMPILER_MSC)
  for (;;)
  {
    if (0 == m_impl->m_h || INVALID_HANDLE_VALUE == m_impl->m_h || 0 == m_impl->m_fd.cFileName[0])
    {
      break;
    }

    for (;;)
    {
      if (!::FindNextFile(m_impl->m_h, &m_impl->m_fd) || 0 == m_impl->m_fd.cFileName[0])
        break;

      if (IsDotOrDotDotDir(m_impl->m_fd.cFileName))
        continue;

      m_count++;
      m_impl->m_fd.cFileName[(sizeof(m_impl->m_fd.cFileName) / sizeof(m_impl->m_fd.cFileName[0])) - 1] = 0;
      m_item_name = m_impl->m_fd.cFileName;
      m_full_path_name = ON_wString::EmptyString;
      return true;
    }

    break;
  }
#else

  // gcc code
  ON__UINT64 current_file_attributes = 0;
  wchar_t current_name[ sizeof(m_impl->m_current_name)/sizeof(m_impl->m_current_name[0]) ];
  for(;;)
  {
    current_file_attributes = 0;
    struct dirent* dp = 0;
    int readdir_errno = readdir_r(m_impl->m_dir, &m_impl->m_dirent, &dp);
    if ( 0 !=  readdir_errno )
      break;
    if ( 0 == dp )
      break;
    if ( 0 == m_impl->m_dirent.d_name[0] )
      break;

    if ( IsDotOrDotDotDir(m_impl->m_dirent.d_name) )
      continue;

    memset( current_name, 0, sizeof(current_name) );
    ON_ConvertUTF8ToWideChar(
      false, // no BOM in input file name as utf8 string
      &m_impl->m_dirent.d_name[0],
      -1, // null terminated utf8 string
      &current_name[0], ((int)(sizeof(current_name)/sizeof(current_name[0]))) - 1, // output wchar_t string
      0, // null output error status
      (4|8|16), // mask common conversion errors
      0, // error_code_point = null terminator inserted at point of conversion error
      0  // null ouput end-of-string pointer
      );
    // TODO
    //   Test m_dirent.d_name to make sure it passes m_ws/utf8_file_name_filter

    ON_wString wpath = m_directory;
    wpath += '/';
    wpath += current_name;

    // get a utf8 version of the full path to pass to stat
    const ON_String utf8buffer(wpath);
    const char* utf8path = utf8buffer;
    if ( 0 == utf8path )
      continue;

    struct stat buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = stat( utf8path, &buf);
    if ( 0 != stat_errno )
      continue;

    if ( S_ISDIR(buf.st_mode) )
    {
      current_file_attributes = 2;
    }
    else if ( S_ISREG(buf.st_mode) )
    {
      // Only *.ext filters work at this time for non-windows
      const wchar_t* file_name_filter = m_impl->m_ws_file_name_filter;
      if (   0 != file_name_filter
            && '*' == file_name_filter[0] 
            && '.' == file_name_filter[1]
            && 0 != file_name_filter[2]
            && '*' != file_name_filter[2] )
      {
        // assume this is a *.extension filter
        const wchar_t* current_name_ext = 0;
        on_wsplitpath(current_name,0,0,0,&current_name_ext);
        if (   0 == current_name_ext 
            || 0 != wcscmp(file_name_filter+1,current_name_ext) 
           )
        {
          // current_name does pass match file_name_filter
          continue;
        }
      }
      current_file_attributes = 1;
    }
    else
      continue;

    // save current item information
    memcpy( m_impl->m_current_name, current_name, sizeof(m_impl->m_current_name) );
    m_impl->m_current_file_attributes = current_file_attributes;
    m_impl->m_current_file_size = buf.st_size;
    m_impl->m_current_content_last_modified_time = buf.st_mtime;

    m_item_name = m_impl->m_current_name;
    m_full_path_name = ON_wString::EmptyString;
    return true;
  }

#endif
  const ON__UINT64 saved_count = m_count;
  Reset();
  m_count = saved_count;
  m_state = 3;
  return false;
}